

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderVkImpl.hpp
# Opt level: O0

char * __thiscall Diligent::ShaderVkImpl::GetEntryPoint(ShaderVkImpl *this)

{
  bool bVar1;
  Char *Message;
  char *pcVar2;
  undefined1 local_30 [8];
  string msg;
  ShaderVkImpl *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = ShaderBase<Diligent::EngineVkImplTraits>::IsCompiling
                    (&this->super_ShaderBase<Diligent::EngineVkImplTraits>);
  if (bVar1) {
    FormatString<char[109]>
              ((string *)local_30,
               (char (*) [109])
               "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status."
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetEntryPoint",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/include/ShaderVkImpl.hpp"
               ,0x65);
    std::__cxx11::string::~string((string *)local_30);
  }
  pcVar2 = (char *)std::__cxx11::string::c_str();
  return pcVar2;
}

Assistant:

const char* GetEntryPoint() const
    {
        DEV_CHECK_ERR(!IsCompiling(), "Shader resources are not available until the shader is compiled. Use GetStatus() to check the shader status.");
        return m_EntryPoint.c_str();
    }